

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_flip.cpp
# Opt level: O3

Reals __thiscall
Omega_h::compute_flip_normals_dim<2>
          (Omega_h *this,Mesh *mesh,Bytes *sides_are_exposed,Bytes *verts_matter,
          Real simple_algorithm_threshold)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  int *piVar2;
  Alloc *pAVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  LO LVar4;
  void *extraout_RDX;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  Reals RVar8;
  Write<double> out;
  Reals coords;
  LOs verts_that_matter;
  LOs sv2v;
  type f;
  Bytes sides_are_exposed_copy;
  Adj v2s;
  Write<double> local_168;
  element_type *local_158;
  Write<double> local_150;
  Alloc *local_140;
  element_type *local_138;
  Read<signed_char> local_130;
  Alloc *local_120;
  pointer local_118;
  Alloc *local_110;
  element_type *local_108;
  type local_100;
  Read<signed_char> local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  element_type *local_60;
  Adj local_58;
  
  local_158 = (element_type *)simple_algorithm_threshold;
  Mesh::ask_up(&local_58,mesh,0,1);
  Mesh::ask_verts_of((Mesh *)&local_110,(Int)mesh);
  local_130.write_.shared_alloc_.alloc = (verts_matter->write_).shared_alloc_.alloc;
  if (((ulong)local_130.write_.shared_alloc_.alloc & 7) == 0 &&
      local_130.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_130.write_.shared_alloc_.alloc =
           (Alloc *)((local_130.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_130.write_.shared_alloc_.alloc)->use_count =
           (local_130.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_130.write_.shared_alloc_.direct_ptr = (verts_matter->write_).shared_alloc_.direct_ptr;
  collect_marked((Omega_h *)&local_120,&local_130);
  pAVar3 = local_130.write_.shared_alloc_.alloc;
  if (((ulong)local_130.write_.shared_alloc_.alloc & 7) == 0 &&
      local_130.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)local_130.write_.shared_alloc_.alloc + 0x30);
    *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc(local_130.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  Mesh::coords((Mesh *)&local_140);
  LVar4 = Mesh::nverts(mesh);
  local_100.verts_that_matter.write_.shared_alloc_.alloc = (Alloc *)&local_100.v2s;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"");
  Write<double>::Write(&local_168,LVar4 * 2,0.0,(string *)&local_100);
  if (local_100.verts_that_matter.write_.shared_alloc_.alloc != (Alloc *)&local_100.v2s) {
    operator_delete(local_100.verts_that_matter.write_.shared_alloc_.alloc,
                    (ulong)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                     *)&(local_100.v2s.super_Graph.a2ab.write_.shared_alloc_.alloc)
                                        ->size)->_M_ptr + 1));
  }
  local_68._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (sides_are_exposed->write_).shared_alloc_.alloc;
  if (((ulong)local_68._M_pi & 7) == 0 && (Alloc *)local_68._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_68._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(((Alloc *)local_68._M_pi)->size * 8 + 1)
      ;
    }
    else {
      ((Alloc *)local_68._M_pi)->use_count = ((Alloc *)local_68._M_pi)->use_count + 1;
    }
  }
  this_00._M_pi = local_68._M_pi;
  local_100.sides_are_exposed_copy.write_.shared_alloc_.direct_ptr =
       (sides_are_exposed->write_).shared_alloc_.direct_ptr;
  local_100.verts_that_matter.write_.shared_alloc_.alloc = local_120;
  if (((ulong)local_120 & 7) == 0 && local_120 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_100.verts_that_matter.write_.shared_alloc_.alloc = (Alloc *)(local_120->size * 8 + 1);
    }
    else {
      local_120->use_count = local_120->use_count + 1;
    }
  }
  local_100.verts_that_matter.write_.shared_alloc_.direct_ptr = local_118;
  local_100.v2s.super_Graph.a2ab.write_.shared_alloc_.alloc =
       local_58.super_Graph.a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_58.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_58.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_100.v2s.super_Graph.a2ab.write_.shared_alloc_.alloc =
           (Alloc *)((long)(local_58.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_58.super_Graph.a2ab.write_.shared_alloc_.alloc + 0x30))->
               _vptr__Sp_counted_base =
           *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)local_58.super_Graph.a2ab.write_.shared_alloc_.alloc + 0x30))->
                    _vptr__Sp_counted_base + 1;
    }
  }
  local_100.v2s.super_Graph.a2ab.write_.shared_alloc_.direct_ptr =
       local_58.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
  local_100.v2s.super_Graph.ab2b.write_.shared_alloc_.alloc =
       local_58.super_Graph.ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_58.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_58.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_100.v2s.super_Graph.ab2b.write_.shared_alloc_.alloc =
           (Alloc *)((long)(local_58.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_58.super_Graph.ab2b.write_.shared_alloc_.alloc + 0x30))->
               _vptr__Sp_counted_base =
           *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)local_58.super_Graph.ab2b.write_.shared_alloc_.alloc + 0x30))->
                    _vptr__Sp_counted_base + 1;
    }
  }
  local_100.v2s.super_Graph.ab2b.write_.shared_alloc_.direct_ptr =
       local_58.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_100.v2s.codes.write_.shared_alloc_.alloc = local_58.codes.write_.shared_alloc_.alloc;
  if (((ulong)local_58.codes.write_.shared_alloc_.alloc & 7) == 0 &&
      local_58.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_100.v2s.codes.write_.shared_alloc_.alloc =
           (Alloc *)((long)(local_58.codes.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_58.codes.write_.shared_alloc_.alloc + 0x30))->_vptr__Sp_counted_base =
           *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)local_58.codes.write_.shared_alloc_.alloc + 0x30))->
                    _vptr__Sp_counted_base + 1;
    }
  }
  local_100.v2s.codes.write_.shared_alloc_.direct_ptr =
       local_58.codes.write_.shared_alloc_.direct_ptr;
  bVar6 = (Alloc *)local_68._M_pi != (Alloc *)0x0;
  bVar7 = ((ulong)local_68._M_pi & 7) == 0;
  local_100.sides_are_exposed_copy.write_.shared_alloc_.alloc = (Alloc *)local_68._M_pi;
  if (bVar7 && bVar6) {
    if (entering_parallel == '\x01') {
      local_100.sides_are_exposed_copy.write_.shared_alloc_.alloc =
           (Alloc *)((long)(local_68._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_68._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_68._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_100.sv2v.write_.shared_alloc_.alloc = local_110;
  if (((ulong)local_110 & 7) == 0 && local_110 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_100.sv2v.write_.shared_alloc_.alloc = (Alloc *)(local_110->size * 8 + 1);
    }
    else {
      local_110->use_count = local_110->use_count + 1;
    }
  }
  local_100.sv2v.write_.shared_alloc_.direct_ptr = local_108;
  local_100.coords.write_.shared_alloc_.alloc = local_140;
  if (((ulong)local_140 & 7) == 0 && local_140 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_100.coords.write_.shared_alloc_.alloc = (Alloc *)(local_140->size * 8 + 1);
    }
    else {
      local_140->use_count = local_140->use_count + 1;
    }
  }
  local_100.coords.write_.shared_alloc_.direct_ptr = local_138;
  local_100.threshold_copy = (Real)local_158;
  local_100.out.shared_alloc_.alloc = local_168.shared_alloc_.alloc;
  if (((ulong)local_168.shared_alloc_.alloc & 7) == 0 &&
      local_168.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_100.out.shared_alloc_.alloc = (Alloc *)((local_168.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_168.shared_alloc_.alloc)->use_count = (local_168.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_100.out.shared_alloc_.direct_ptr = local_168.shared_alloc_.direct_ptr;
  if (((ulong)local_120 & 1) == 0) {
    uVar5 = local_120->size;
  }
  else {
    uVar5 = (ulong)local_120 >> 3;
  }
  local_60 = (element_type *)local_100.sides_are_exposed_copy.write_.shared_alloc_.direct_ptr;
  parallel_for<Omega_h::compute_flip_normals_dim<2>(Omega_h::Mesh*,Omega_h::Read<signed_char>,Omega_h::Read<signed_char>,double)::_lambda(int)_1_>
            ((LO)(uVar5 >> 2),&local_100,"compute_flip_normals");
  local_150.shared_alloc_.alloc = local_168.shared_alloc_.alloc;
  if (((ulong)local_168.shared_alloc_.alloc & 7) == 0 &&
      local_168.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_150.shared_alloc_.alloc = (Alloc *)((local_168.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_168.shared_alloc_.alloc)->use_count = (local_168.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_150.shared_alloc_.direct_ptr = local_168.shared_alloc_.direct_ptr;
  Read<double>::Read(&local_78,&local_150);
  Mesh::sync_array<double>((Mesh *)this,(Int)mesh,(Read<double> *)0x0,(Int)&local_78);
  if (((ulong)local_78.write_.shared_alloc_.alloc & 7) == 0 &&
      local_78.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)local_78.write_.shared_alloc_.alloc + 0x30);
    *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc(local_78.write_.shared_alloc_.alloc);
      operator_delete(local_78.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar3 = local_150.shared_alloc_.alloc;
  if (((ulong)local_150.shared_alloc_.alloc & 7) == 0 &&
      local_150.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_150.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_150.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  compute_flip_normals_dim<2>(Omega_h::Mesh*,Omega_h::Read<signed_char>,Omega_h::Read<signed_char>,double)
  ::{lambda(int)#1}::~Mesh((_lambda_int__1_ *)&local_100);
  if (bVar7 && bVar6) {
    p_Var1 = this_00._M_pi + 3;
    *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc((Alloc *)this_00._M_pi);
      operator_delete(this_00._M_pi,0x48);
    }
  }
  if (((ulong)local_168.shared_alloc_.alloc & 7) == 0 &&
      local_168.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_168.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_168.shared_alloc_.alloc);
      operator_delete(local_168.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_140 & 7) == 0 && local_140 != (Alloc *)0x0) {
    piVar2 = &local_140->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_140);
      operator_delete(local_140,0x48);
    }
  }
  if (((ulong)local_120 & 7) == 0 && local_120 != (Alloc *)0x0) {
    piVar2 = &local_120->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_120);
      operator_delete(local_120,0x48);
    }
  }
  if (((ulong)local_110 & 7) == 0 && local_110 != (Alloc *)0x0) {
    piVar2 = &local_110->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_110);
      operator_delete(local_110,0x48);
    }
  }
  Adj::~Adj(&local_58);
  RVar8.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar8.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar8.write_.shared_alloc_;
}

Assistant:

Reals compute_flip_normals_dim(Mesh* mesh, Bytes sides_are_exposed,
    Bytes verts_matter,
    Real simple_algorithm_threshold = 0.95)  // constant given by Aubry and Lohner
{
  constexpr auto side_dim = dim - 1;
  auto v2s = mesh->ask_up(VERT, side_dim);
  auto sv2v = mesh->ask_verts_of(side_dim);
  auto verts_that_matter = collect_marked(verts_matter);
  auto coords = mesh->coords();
  auto out = Write<Real>(mesh->nverts() * dim, 0.0);
  auto const threshold_copy = simple_algorithm_threshold;
  auto sides_are_exposed_copy = sides_are_exposed;
  auto f = OMEGA_H_LAMBDA(LO vm) {
    auto v = verts_that_matter[vm];
    auto N_c = zero_vector<dim>();
    constexpr auto max_adj_sides =
        SimplexAvgDegree<side_dim, VERT, side_dim>::value * 4;
    Few<Vector<dim>, max_adj_sides> N;
    auto n = 0;
    for (auto vs = v2s.a2ab[v]; vs < v2s.a2ab[v + 1]; ++vs) {
      auto s = v2s.ab2b[vs];
      if (!sides_are_exposed_copy[s]) continue;
      OMEGA_H_CHECK(n < max_adj_sides);
      constexpr auto side_dim2 = dim - 1;
      auto ssv2v = gather_verts<side_dim2 + 1>(sv2v, s);
      auto ssv2x = gather_vectors<side_dim2 + 1, dim>(coords, ssv2v);
      auto svec = get_side_vector(ssv2x);
      N_c += svec;  // svec is the area weighted face normal
      N[n++] = normalize(svec);
    }
    // as suggested by Aubry and Lohner, start with an initial guess done by
    // some kind of averaging (area weighted being an option)
    N_c = normalize(N_c);
    // if that is roughly the same as all the face normals, just accept it
    // and don't bother with the expensive algorithm.
    // this is especially a good idea because most models are mostly flat
    // surfaces
    Int i;
    for (i = 0; i < n; ++i) {
      if (N_c * N[i] < threshold_copy) break;
    }
    if (i < n) {
      // nope, we actually have some nontrivial normals here.
      // run the super expensive algorithm.
      N_c = get_most_normal_normal(N, n);
    }
    set_vector(out, v, N_c);
  };
  parallel_for(verts_that_matter.size(), f, "compute_flip_normals");
  return mesh->sync_array(VERT, Reals(out), dim);
}